

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ViewTest::queryTest<true>(ViewTest *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  size_t sVar2;
  logic_error *plVar3;
  code *pcVar4;
  int *piVar5;
  undefined *puVar6;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  allocator_type local_59;
  undefined1 local_58 [16];
  size_t *local_48;
  size_t *local_40;
  size_t *local_38;
  size_t local_30;
  size_t local_28;
  CoordinateOrder local_20;
  bool local_1c;
  
  local_58._0_8_ = this;
  local_48 = (size_t *)operator_new(0);
  local_30 = 0;
  local_28 = 1;
  local_20 = LastMajorOrder;
  local_1c = true;
  local_40 = local_48;
  local_38 = local_48;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_58);
  if ((ViewTest *)local_58._0_8_ == (ViewTest *)0x0) {
    plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar3,"Assertion failed.");
    pcVar4 = std::runtime_error::~runtime_error;
    puVar6 = &std::runtime_error::typeinfo;
  }
  else {
    if ((local_30 == 0) && (local_28 == 1)) {
      operator_delete(local_48,0);
      _Var1._M_current = (unsigned_long *)operator_new(8);
      *_Var1._M_current = 0x18;
      piVar5 = this->data_;
      local_58._0_8_ = piVar5;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)(local_58 + 8),_Var1,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var1._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,&local_59);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_58);
      if ((int *)local_58._0_8_ == (int *)0x0) {
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar3,"Assertion failed.");
        pcVar4 = std::runtime_error::~runtime_error;
        puVar6 = &std::runtime_error::typeinfo;
      }
      else {
        if ((local_30 == 1) && (local_28 == 0x18)) {
          sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_58,0);
          if (sVar2 == 0x18) {
            operator_delete(local_48,local_30 * 0x18);
            operator_delete(_Var1._M_current,8);
            _Var1._M_current = (unsigned_long *)operator_new(0x10);
            *_Var1._M_current = 4;
            _Var1._M_current[1] = 6;
            local_58._0_8_ = piVar5;
            andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
            Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      ((Geometry<std::allocator<unsigned_long>> *)(local_58 + 8),_Var1,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )(_Var1._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
                       &local_59);
            andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_58);
            if ((int *)local_58._0_8_ == (int *)0x0) {
              plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error((runtime_error *)plVar3,"Assertion failed.");
              pcVar4 = std::runtime_error::~runtime_error;
              puVar6 = &std::runtime_error::typeinfo;
            }
            else {
              if ((local_30 == 2) && (local_28 == 0x18)) {
                sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_58,0);
                if (sVar2 == 4) {
                  sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_58,1);
                  if (sVar2 == 6) {
                    operator_delete(local_48,local_30 * 0x18);
                    operator_delete(_Var1._M_current,0x10);
                    _Var1._M_current = (unsigned_long *)operator_new(0x18);
                    *_Var1._M_current = 3;
                    _Var1._M_current[1] = 4;
                    _Var1._M_current[2] = 2;
                    local_58._0_8_ = piVar5;
                    andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                    Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                              ((Geometry<std::allocator<unsigned_long>> *)(local_58 + 8),_Var1,
                               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                )(_Var1._M_current + 3),&andres::defaultOrder,&andres::defaultOrder,
                               &local_59);
                    andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                              ((View<int,_true,_std::allocator<unsigned_long>_> *)local_58);
                    if ((int *)local_58._0_8_ == (int *)0x0) {
                      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar3,"Assertion failed.")
                      ;
                      pcVar4 = std::runtime_error::~runtime_error;
                      puVar6 = &std::runtime_error::typeinfo;
                    }
                    else {
                      if ((local_30 == 3) && (local_28 == 0x18)) {
                        sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                                          ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                           local_58,0);
                        if (sVar2 == 3) {
                          sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                                            ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                             local_58,1);
                          if (sVar2 == 4) {
                            sVar2 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                                              ((View<int,_true,_std::allocator<unsigned_long>_> *)
                                               local_58,2);
                            if (sVar2 == 2) {
                              operator_delete(local_48,local_30 * 0x18);
                              operator_delete(_Var1._M_current,0x18);
                              return;
                            }
                          }
                        }
                      }
                      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar3,"test failed.");
                      pcVar4 = std::logic_error::~logic_error;
                      puVar6 = &std::logic_error::typeinfo;
                    }
                    __cxa_throw(plVar3,puVar6,pcVar4);
                  }
                }
              }
              plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar3,"test failed.");
              pcVar4 = std::logic_error::~logic_error;
              puVar6 = &std::logic_error::typeinfo;
            }
            __cxa_throw(plVar3,puVar6,pcVar4);
          }
        }
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar3,"test failed.");
        pcVar4 = std::logic_error::~logic_error;
        puVar6 = &std::logic_error::typeinfo;
      }
      __cxa_throw(plVar3,puVar6,pcVar4);
    }
    plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar3,"test failed.");
    pcVar4 = std::logic_error::~logic_error;
    puVar6 = &std::logic_error::typeinfo;
  }
  __cxa_throw(plVar3,puVar6,pcVar4);
}

Assistant:

void ViewTest::queryTest(){
    // scalar
    {
        andres::View<int, constTarget> v(&scalar_);
        test(v.dimension()== 0 &&
               v.size()== 1);
    }
    // 1D
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

        test(v.dimension()==1 && 
               v.size()==24 &&
               v.shape(0)==24);
    }
    // 2D 
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 4;
        shape[1] = 6; 
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

        test(v.dimension()== 2 &&
               v.size()== 24 &&
               v.shape(0)== 4 &&
               v.shape(1)== 6); 
    }
    // 3D
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4;
        shape[2] = 2;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

        test(v.dimension()== 3 &&
               v.size()== 24 && 
               v.shape(0)== 3 && 
               v.shape(1)== 4 &&
               v.shape(2)== 2);
    }
}